

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O1

void run_test_evict(VMEMcache *cache,uint n_threads,os_thread_t *threads,uint ops_per_thread,
                   context *ctx,int by_key)

{
  int iVar1;
  int *piVar2;
  ulong *puVar3;
  long lVar4;
  code *pcVar5;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar6;
  VMEMcache *cache_00;
  uint *puVar7;
  ulong uVar9;
  ulong uVar10;
  void *arg;
  char *pcVar11;
  os_thread_t *thread_00;
  undefined1 auStack_1e0 [264];
  os_thread_t oStack_d8;
  ulong *puStack_b8;
  stat_t *psStack_b0;
  ulong uStack_a8;
  code *pcStack_a0;
  code *pcStack_98;
  stat_t sStack_90;
  stat_t sStack_88;
  stat_t sStack_80;
  stat_t sStack_78;
  ulong uStack_70;
  context *pcStack_68;
  code *apcStack_60 [2];
  VMEMcache *local_50;
  os_thread_t *local_48;
  int local_3c;
  ulong local_38;
  undefined8 uVar8;
  
  uVar10 = (ulong)n_threads;
  apcStack_60[0] = (code *)0x10361c;
  local_50 = cache;
  local_48 = threads;
  local_3c = by_key;
  free_cache(cache);
  local_38 = 0;
  if (n_threads != 0) {
    do {
      cache_00 = ctx->cache;
      apcStack_60[0] = (code *)0x10364a;
      puVar3 = &local_38;
      iVar1 = vmemcache_put(cache_00,&local_38,8,&local_38,8);
      if (iVar1 != 0) {
        apcStack_60[0] = free_cache;
        run_test_evict_cold_1();
        uStack_70 = uVar10;
        pcStack_68 = ctx;
        apcStack_60[0] = (code *)&stack0xfffffffffffffff8;
        do {
          pcStack_98 = (code *)0x103741;
          iVar1 = vmemcache_evict(cache_00,0,0);
        } while (iVar1 == 0);
        pcStack_98 = (code *)0x103759;
        get_stat(cache_00,&sStack_90,VMEMCACHE_STAT_ENTRIES);
        pcStack_98 = (code *)0x10376a;
        get_stat(cache_00,&sStack_88,VMEMCACHE_STAT_HEAP_ENTRIES);
        pcStack_98 = (code *)0x10377b;
        get_stat(cache_00,&sStack_80,VMEMCACHE_STAT_DRAM_SIZE_USED);
        pcStack_98 = (code *)0x10378c;
        get_stat(cache_00,&sStack_78,VMEMCACHE_STAT_POOL_SIZE_USED);
        if (sStack_90 == 0) {
          if (sStack_80 != 0) goto LAB_001037b9;
          if (sStack_78 == 0) {
            if (sStack_88 == 1) {
              return;
            }
            goto LAB_001037cb;
          }
        }
        else {
          pcStack_98 = (code *)0x1037b9;
          free_cache_cold_1();
LAB_001037b9:
          pcStack_98 = (code *)0x1037c2;
          free_cache_cold_2();
        }
        pcStack_98 = (code *)0x1037cb;
        free_cache_cold_3();
LAB_001037cb:
        pcStack_98 = on_miss_cb;
        free_cache_cold_4();
        puVar7 = (uint *)puVar3[1];
        pcStack_a0 = (code *)0x103803;
        pcStack_98 = (code *)apcStack_60;
        iVar1 = vmemcache_put();
        if (iVar1 != 0) {
          pcStack_a0 = (code *)0x10380c;
          piVar2 = __errno_location();
          if (*piVar2 != 0x11) {
            pcStack_a0 = worker_thread_get_unique_keys;
            on_miss_cb_cold_1();
            oStack_d8._8_8_ = 0;
            if (puVar7[7] != 0) {
              uVar9 = 0;
              oStack_d8._16_8_ = cache_00;
              oStack_d8._24_8_ = uVar10;
              puStack_b8 = &local_38;
              psStack_b0 = &sStack_90;
              uStack_a8 = (ulong)ops_per_thread;
              pcStack_a0 = (code *)&pcStack_98;
              do {
                oStack_d8.align = ((ulong)*puVar7 << 0x30) + uVar9;
                uVar8 = *(undefined8 *)(puVar7 + 2);
                thread = &oStack_d8;
                lVar4 = vmemcache_get(uVar8,&oStack_d8,8,auStack_1e0,0x100,0,oStack_d8.padding + 8);
                uVar6 = (uint)uVar8;
                if (lVar4 == -1) {
                  worker_thread_get_unique_keys_cold_1();
                  if (uVar6 != 0) {
                    uVar9 = (ulong)uVar6;
                    uVar10 = uVar9;
                    arg = extraout_RDX;
                    thread_00 = thread;
                    do {
                      os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                                       *(_func_void_ptr_void_ptr **)((long)arg + 0x20),arg);
                      thread_00 = thread_00 + 1;
                      arg = (void *)((long)arg + 0x28);
                      uVar10 = uVar10 - 1;
                    } while (uVar10 != 0);
                    do {
                      os_thread_join(thread,(void **)0x0);
                      thread = thread + 1;
                      uVar9 = uVar9 - 1;
                    } while (uVar9 != 0);
                  }
                  return;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < puVar7[7]);
            }
            return;
          }
        }
        return;
      }
      local_38 = local_38 + 1;
    } while (local_38 < uVar10);
  }
  if (n_threads != 0) {
    lVar4 = 0;
    do {
      *(code **)((long)&ctx->worker + lVar4) = worker_thread_test_evict_get;
      *(uint *)((long)&ctx->ops_count + lVar4) = ops_per_thread;
      lVar4 = lVar4 + 0x28;
    } while (uVar10 * 0x28 != lVar4);
  }
  pcVar5 = worker_thread_test_evict_by_key;
  if (local_3c == 0) {
    pcVar5 = worker_thread_test_evict_by_LRU;
  }
  pcVar11 = "_by_key";
  if (local_3c == 0) {
    pcVar11 = "_by_LRU";
  }
  ctx[n_threads - 1].worker = pcVar5;
  apcStack_60[0] = (code *)0x1036dc;
  printf("%s%s: STARTED\n","run_test_evict",pcVar11);
  LOCK();
  keep_running = 1;
  UNLOCK();
  apcStack_60[0] = (code *)0x1036f6;
  run_threads(n_threads,local_48,ctx);
  apcStack_60[0] = (code *)0x1036ff;
  free_cache(local_50);
  apcStack_60[0] = (code *)0x103713;
  printf("%s%s: PASSED\n","run_test_evict",pcVar11);
  return;
}

Assistant:

static void
run_test_evict(VMEMcache *cache, unsigned n_threads, os_thread_t *threads,
		unsigned ops_per_thread, struct context *ctx, int by_key)
{
	free_cache(cache);

	for (unsigned long long n = 0; n < n_threads; ++n) {
		if (vmemcache_put(ctx->cache, &n, sizeof(n), &n, sizeof(n)))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].worker = worker_thread_test_evict_get;
		ctx[i].ops_count = ops_per_thread;
	}

	/* overwrite the last routine */
	if (by_key)
		ctx[n_threads - 1].worker = worker_thread_test_evict_by_key;
	else
		ctx[n_threads - 1].worker = worker_thread_test_evict_by_LRU;

	printf("%s%s: STARTED\n", __func__, by_key ? "_by_key" : "_by_LRU");

	__atomic_store_n(&keep_running, 1, __ATOMIC_SEQ_CST);
	run_threads(n_threads, threads, ctx);

	/* success of this function is the main success criteria of this test */
	free_cache(cache);

	printf("%s%s: PASSED\n", __func__, by_key ? "_by_key" : "_by_LRU");
}